

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdReplace<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this,Instr instr)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  undefined1 local_24 [8];
  Simd<unsigned_short,_(unsigned_char)__b_> simd;
  uint val;
  Thread *this_local;
  
  unique0x10000084 = this;
  simd.v._8_4_ = Pop<unsigned_int>(this);
  _local_24 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  uVar2 = simd.v[4];
  puVar1 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                     ((Simd<unsigned_short,_(unsigned_char)__b_> *)local_24,instr.field_2.imm_u8);
  *puVar1 = uVar2;
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,_local_24);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}